

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg_Data.h
# Opt level: O0

void __thiscall
Nova::Arg_Data::Initialize
          (Arg_Data *this,string *input_str,string *input_val_name,string *input_desc,
          string *default_val_name)

{
  long lVar1;
  string *default_val_name_local;
  string *input_desc_local;
  string *input_val_name_local;
  string *input_str_local;
  Arg_Data *this_local;
  
  std::__cxx11::string::operator=((string *)&this->str,(string *)input_str);
  this->value_set = false;
  lVar1 = std::__cxx11::string::length();
  if (lVar1 == 0) {
    lVar1 = std::__cxx11::string::length();
    if (lVar1 != 0) {
      std::__cxx11::string::operator=((string *)&this->val_name,(string *)default_val_name);
    }
  }
  else {
    std::__cxx11::string::operator=((string *)&this->val_name,(string *)input_val_name);
  }
  lVar1 = std::__cxx11::string::length();
  if (lVar1 == 0) {
    lVar1 = std::__cxx11::string::length();
    if (lVar1 == 0) {
      std::__cxx11::string::operator=((string *)&this->desc,"<no description available>");
    }
    else {
      std::__cxx11::string::operator=((string *)&this->desc,(string *)input_val_name);
    }
  }
  else {
    std::__cxx11::string::operator=((string *)&this->desc,(string *)input_desc);
  }
  return;
}

Assistant:

void Initialize(const std::string& input_str,const std::string& input_val_name,const std::string& input_desc,const std::string& default_val_name="")
    {
        str=input_str;value_set=false;
        if(input_val_name.length()) val_name=input_val_name;
        else if(default_val_name.length()) val_name=default_val_name;
        if(!input_desc.length())
        {
            if(input_val_name.length()) desc=input_val_name;
            else desc="<no description available>";
        }
        else desc=input_desc;
    }